

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

BSDF * __thiscall
pbrt::SurfaceInteraction::GetBSDF
          (BSDF *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *ray,
          SampledWavelengths *lambda,CameraHandle *camera,ScratchBuffer *scratchBuffer,
          SamplerHandle *sampler)

{
  Vector3f *woRender;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Tuple2<pbrt::Point2,_float> TVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar14;
  Vector3f dpdvs;
  Vector3f dpdus;
  undefined1 auVar15 [16];
  Point3fi *pPVar16;
  Point3fi *pPVar17;
  BSDF *pBVar18;
  uintptr_t iptr;
  ulong *puVar19;
  undefined1 (*pauVar20) [16];
  int samplesPerPixel;
  ulong uVar21;
  uintptr_t uVar22;
  ulong uVar23;
  DebugMLTSampler *this_00;
  undefined1 auVar24 [16];
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 extraout_XMM0_Db;
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar32 [56];
  undefined1 auVar31 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  Normal3f ns;
  span<const_float> uc;
  span<const_pbrt::Point2<float>_> u;
  SampledSpectrum SVar40;
  DispatchSplit<5> local_1ba;
  undefined1 local_1b9;
  uint local_1b8;
  undefined4 uStack_1b4;
  float local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  ScratchBuffer *local_178;
  BSDF *local_170;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_168;
  float local_160;
  float fStack_15c;
  undefined1 *puStack_158;
  BumpEvalContext *pBStack_150;
  undefined8 uStack_148;
  ulong local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  BxDFHandle local_128;
  undefined8 local_120;
  float fStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined8 uStack_108;
  undefined4 uStack_100;
  float fStack_fc;
  float fStack_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  undefined4 uStack_e8;
  int iStack_e4;
  undefined8 local_e0;
  float local_d8;
  undefined4 local_d4;
  undefined4 uStack_d0;
  float local_cc;
  undefined8 local_c8;
  float local_c0;
  undefined4 local_bc;
  undefined4 uStack_b8;
  float local_b4;
  BumpEvalContext local_b0;
  undefined1 extraout_var [60];
  
  local_1a8._8_8_ = local_1a8._0_8_;
  local_1a8._0_8_ = lambda;
  local_168.bits =
       (camera->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  uVar21 = (sampler->
           super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
  uVar14 = (ushort)(uVar21 >> 0x30);
  if (uVar21 >> 0x30 < 5) {
    if (uVar14 < 3) {
      samplesPerPixel = *(int *)(uVar21 & 0xffffffffffff);
      if (uVar14 == 2) {
        samplesPerPixel = samplesPerPixel * ((int *)(uVar21 & 0xffffffffffff))[1];
      }
    }
    else {
LAB_002e84b7:
      samplesPerPixel = *(int *)(uVar21 & 0xffffffffffff);
    }
  }
  else {
    if ((6 < uVar14) || (uVar14 != 6)) goto LAB_002e84b7;
    samplesPerPixel = 1 << (*(byte *)((uVar21 & 0xffffffffffff) + 4) & 0x1f);
  }
  local_178 = scratchBuffer;
  local_170 = __return_storage_ptr__;
  ComputeDifferentials(this,ray,(CameraHandle *)&local_168,samplesPerPixel);
  uVar22 = (this->material).
           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           .bits;
  if ((short)(uVar22 >> 0x30) == 0xb) {
    local_188._0_8_ = &this->dpdx;
    local_198._0_8_ = &this->dpdy;
    do {
      pPVar16 = &(this->super_Interaction).pi;
      pPVar17 = &(this->super_Interaction).pi;
      auVar24._0_4_ =
           (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar24._4_4_ =
           (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
      ;
      auVar24._8_4_ =
           (pPVar17->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar24._12_4_ =
           (pPVar17->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
      ;
      uVar35 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar24 = vinsertps_avx(auVar24,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      auVar26._0_4_ = (float)uVar35 + auVar24._0_4_;
      auVar26._4_4_ = (float)((ulong)uVar35 >> 0x20) + auVar24._4_4_;
      auVar26._8_4_ = auVar24._8_4_ + 0.0;
      auVar26._12_4_ = auVar24._12_4_ + 0.0;
      auVar12._8_4_ = 0x3f000000;
      auVar12._0_8_ = 0x3f0000003f000000;
      auVar12._12_4_ = 0x3f000000;
      auVar24 = vmulps_avx512vl(auVar26,auVar12);
      fStack_118 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
                   (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      local_120 = vmovlps_avx(auVar24);
      uStack_10c = *(undefined4 *)(local_188._0_8_ + 8);
      uStack_114 = (undefined4)*(undefined8 *)local_188._0_8_;
      uStack_110 = (undefined4)((ulong)*(undefined8 *)local_188._0_8_ >> 0x20);
      uStack_100 = *(undefined4 *)(local_198._0_8_ + 8);
      uStack_108 = *(undefined8 *)local_198._0_8_;
      TVar6 = (this->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
      fStack_fc = TVar6.x;
      fStack_f8 = TVar6.y;
      auVar11._0_4_ = this->dudx;
      auVar11._4_4_ = this->dvdx;
      auVar11._8_4_ = this->dudy;
      auVar11._12_4_ = this->dvdy;
      auVar24 = vpermilps_avx(auVar11,0xd8);
      uStack_f4 = auVar24._0_4_;
      uStack_f0 = auVar24._4_8_;
      uStack_e8 = auVar24._12_4_;
      iStack_e4 = this->faceIndex;
      local_d8 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
      local_e0._0_4_ = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
      local_e0._4_4_ = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
      local_cc = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
      uVar3 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
      uVar7 = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_c0 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
      local_c8._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
      local_c8._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
      local_b4 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
      uVar4 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar8 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
      local_d4 = uVar3;
      uStack_d0 = uVar7;
      local_bc = uVar4;
      uStack_b8 = uVar8;
      MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>
                ((MixMaterial *)&local_b0,uVar22 & 0xffffffffffff);
      (this->material).
      super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      .bits = local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_;
      uVar22 = local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_;
    } while ((local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ & 0xffff000000000000) ==
             0xb000000000000);
  }
  pBVar18 = local_170;
  puVar19 = (ulong *)(uVar22 & 0xffffffffffff);
  if (puVar19 == (ulong *)0x0) {
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(local_170->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0;
    (pBVar18->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (pBVar18->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (local_170->bxdf).
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
    .bits = 0;
    (pBVar18->ng).super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
    (pBVar18->ng).super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
    *(undefined8 *)&(local_170->ng).super_Tuple3<pbrt::Normal3,_float>.z = 0;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    *(undefined8 *)&(local_170->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    (pBVar18->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
    (pBVar18->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
    (local_170->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
    return local_170;
  }
  uVar14 = (ushort)(uVar22 >> 0x30);
  if ((uint)(uVar22 >> 0x31) < 3) {
LAB_002e86fd:
    uVar21 = *puVar19;
  }
  else {
    if (8 < uVar14) {
      if (0xaffffffffffff < uVar22) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/materials.h"
                 ,0x132,"Shouldn\'t be called");
      }
      goto LAB_002e86fd;
    }
    if (uVar14 != 7) goto LAB_002e86fd;
    uVar21 = 0;
  }
  if (0x5ffffffffffff < uVar22) {
    if (uVar14 < 9) {
      if (uVar14 == 7) {
        uVar23 = 0;
        goto LAB_002e872b;
      }
    }
    else if (0xaffffffffffff < uVar22) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/materials.h"
               ,0x13a,"Shouldn\'t be called");
    }
  }
  uVar23 = puVar19[1];
LAB_002e872b:
  if ((uVar21 & 0xffffffffffff) != 0 || uVar23 != 0) {
    local_160 = 0.0;
    fStack_15c = 0.0;
    puStack_158._0_4_ = 0.0;
    local_1b8 = 0;
    uStack_1b4 = 0;
    local_1b0 = 0.0;
    local_140 = uVar21;
    BumpEvalContext::BumpEvalContext(&local_b0,this);
    Bump<pbrt::UniversalTextureEvaluator>(&local_140,uVar23,&local_b0,&local_160,&local_1b8);
    auVar33._4_4_ = local_1b0;
    auVar33._0_4_ = uStack_1b4;
    auVar33._8_8_ = 0;
    auVar36._4_4_ = fStack_15c;
    auVar36._0_4_ = local_160;
    auVar36._8_8_ = 0;
    auVar38._4_4_ = puStack_158._0_4_;
    auVar38._0_4_ = fStack_15c;
    auVar38._8_8_ = 0;
    auVar11 = vmovshdup_avx(auVar33);
    auVar24 = vinsertps_avx(ZEXT416(local_1b8),auVar33,0x1c);
    auVar26 = ZEXT416((uint)(auVar11._0_4_ * local_160));
    auVar12 = vfmsub132ss_fma(ZEXT416(local_1b8),auVar26,ZEXT416((uint)puStack_158._0_4_));
    auVar11 = vfnmadd213ss_fma(auVar11,auVar36,auVar26);
    fVar10 = auVar12._0_4_ + auVar11._0_4_;
    auVar27._0_4_ = fStack_15c * auVar24._0_4_;
    auVar27._4_4_ = puStack_158._0_4_ * auVar24._4_4_;
    auVar27._8_4_ = auVar24._8_4_ * 0.0;
    auVar27._12_4_ = auVar24._12_4_ * 0.0;
    auVar11 = vfmsub213ps_fma(auVar33,auVar36,auVar27);
    auVar24 = vfnmadd213ps_fma(auVar24,auVar38,auVar27);
    auVar39._0_4_ = auVar11._0_4_ + auVar24._0_4_;
    auVar39._4_4_ = auVar11._4_4_ + auVar24._4_4_;
    auVar39._8_4_ = auVar11._8_4_ + auVar24._8_4_;
    auVar39._12_4_ = auVar11._12_4_ + auVar24._12_4_;
    auVar34._0_4_ = auVar39._0_4_ * auVar39._0_4_;
    auVar34._4_4_ = auVar39._4_4_ * auVar39._4_4_;
    auVar34._8_4_ = auVar39._8_4_ * auVar39._8_4_;
    auVar34._12_4_ = auVar39._12_4_ * auVar39._12_4_;
    auVar24 = vmovshdup_avx(auVar34);
    fVar25 = auVar34._0_4_ + auVar24._0_4_ + fVar10 * fVar10;
    if (fVar25 < 0.0) {
      local_188 = ZEXT416((uint)fVar10);
      local_198 = auVar39;
      fVar25 = sqrtf(fVar25);
      auVar39 = local_198;
      auVar24 = local_188;
    }
    else {
      auVar24 = vsqrtss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25));
      fVar25 = auVar24._0_4_;
      auVar24 = ZEXT416((uint)fVar10);
    }
    auVar24 = vpermi2ps_avx512vl(_DAT_003f9c60,auVar39,auVar24);
    auVar37._4_4_ = fVar25;
    auVar37._0_4_ = fVar25;
    auVar37._8_4_ = fVar25;
    auVar37._12_4_ = fVar25;
    auVar24 = vdivps_avx(auVar24,auVar37);
    ns.super_Tuple3<pbrt::Normal3,_float>.z = auVar39._0_4_ / fVar25;
    dpdus.super_Tuple3<pbrt::Vector3,_float>.y = fStack_15c;
    dpdus.super_Tuple3<pbrt::Vector3,_float>.x = local_160;
    dpdus.super_Tuple3<pbrt::Vector3,_float>.z = puStack_158._0_4_;
    dpdvs.super_Tuple3<pbrt::Vector3,_float>.y = (float)uStack_1b4;
    dpdvs.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1b8;
    dpdvs.super_Tuple3<pbrt::Vector3,_float>.z = local_1b0;
    ns.super_Tuple3<pbrt::Normal3,_float>._0_8_ = auVar24._0_8_;
    SetShadingGeometry(this,ns,dpdus,dpdvs,
                       (Normal3f)(this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>,
                       (Normal3f)(this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>,false);
  }
  pPVar16 = &(this->super_Interaction).pi;
  pPVar17 = &(this->super_Interaction).pi;
  auVar1._0_4_ = (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 x.low;
  auVar1._4_4_ = (pPVar16->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 x.high;
  auVar1._8_4_ = (pPVar17->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.
                 y.low;
  auVar1._12_4_ =
       (pPVar17->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar35 = *(undefined8 *)
            &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar24 = vinsertps_avx(auVar1,ZEXT416((uint)(this->super_Interaction).pi.
                                               super_Point3<pbrt::Interval>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar28._0_4_ = (float)uVar35 + auVar24._0_4_;
  auVar28._4_4_ = (float)((ulong)uVar35 >> 0x20) + auVar24._4_4_;
  auVar28._8_4_ = auVar24._8_4_ + 0.0;
  auVar28._12_4_ = auVar24._12_4_ + 0.0;
  auVar13._8_4_ = 0x3f000000;
  auVar13._0_8_ = 0x3f0000003f000000;
  auVar13._12_4_ = 0x3f000000;
  auVar24 = vmulps_avx512vl(auVar28,auVar13);
  local_b0.p.super_Tuple3<pbrt::Point3,_float>.z =
       ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
       (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
  pBStack_150 = &local_b0;
  local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.y =
       (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
  local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
  TVar6 = (this->super_Interaction).uv.super_Tuple2<pbrt::Point2,_float>;
  local_b0.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y = (float)this->faceIndex;
  local_b0.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
       (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
  local_b0.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
  local_b0.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
       (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_b0.dvdx = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_b0.dvdy = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar24);
  local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.x =
       (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z;
  uVar5 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar9 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y = TVar6.x;
  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z = TVar6.y;
  auVar2._0_4_ = this->dudx;
  auVar2._4_4_ = this->dvdx;
  auVar2._8_4_ = this->dudy;
  auVar2._12_4_ = this->dvdy;
  auVar24 = vpermilps_avx(auVar2,0xd8);
  local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = auVar24._0_4_;
  local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_ = auVar24._4_8_;
  local_b0.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x = auVar24._12_4_;
  local_b0.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
  local_b0.dudx = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
  local_b0.dudy = (this->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
  local_b0.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
       (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
  local_b0.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
       (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
  local_b0.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
       (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
  local_160 = SUB84(local_178,0);
  fStack_15c = (float)((ulong)local_178 >> 0x20);
  puStack_158 = &local_1b9;
  uStack_148 = local_1a8._0_8_;
  uVar21 = (this->material).
           super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
           .bits;
  local_1b8 = (uint)uVar21;
  uStack_1b4 = (undefined4)(uVar21 >> 0x20);
  local_b0.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar5;
  local_b0.uv.super_Tuple2<pbrt::Point2,_float>.y = (float)uVar9;
  if (uVar21 < 0x6000000000000) {
    uVar35 = 0;
    DispatchSplit<5>::operator()(pBVar18,&local_1ba);
  }
  else {
    uVar35 = 0;
    DispatchSplit<6>::operator()
              (pBVar18,(DispatchSplit<6> *)&local_1ba,&local_1b8,(ushort)(uVar21 >> 0x30) - 5);
  }
  if ((((pBVar18->bxdf).
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
        .bits & 0xffffffffffff) != 0) && (*(char *)(Options + 7) == '\x01')) {
    woRender = &(this->super_Interaction).wo;
    local_188._0_8_ = &(this->super_Interaction).n;
    local_198._0_8_ = &this->shading;
    local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ =
         (sampler->
         super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
         ).bits;
    local_160 = DispatchSplit<9>::operator()
                          ((DispatchSplit<9> *)&local_160,&local_b0,
                           (ulong)local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ >> 0x30);
    uVar21 = (sampler->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
    this_00 = (DebugMLTSampler *)(uVar21 & 0xffffffffffff);
    uVar14 = (ushort)(uVar21 >> 0x30);
    if (uVar21 < 0x5000000000000) {
      if (uVar14 < 3) {
        if (uVar14 == 2) {
          auVar30._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)this_00);
          auVar30._8_56_ = extraout_var_00;
        }
        else {
          auVar30._0_8_ = RandomSampler::Get2D((RandomSampler *)this_00);
          auVar30._8_56_ = extraout_var_04;
        }
      }
      else if (uVar14 == 3) {
        auVar30._0_8_ = HaltonSampler::Get2D((HaltonSampler *)this_00);
        auVar30._8_56_ = extraout_var_02;
      }
      else {
        auVar30._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)this_00);
        auVar30._8_56_ = extraout_var_06;
      }
    }
    else if (uVar14 < 7) {
      if (uVar14 == 6) {
        auVar30._0_8_ = ZSobolSampler::Get2D((ZSobolSampler *)this_00);
        auVar30._8_56_ = extraout_var_01;
      }
      else {
        auVar30._0_8_ = SobolSampler::Get2D((SobolSampler *)this_00);
        auVar30._8_56_ = extraout_var_05;
      }
    }
    else if (uVar21 >> 0x30 == 8) {
      auVar30._0_8_ = MLTSampler::Get2D((MLTSampler *)this_00);
      auVar30._8_56_ = extraout_var_07;
    }
    else if (uVar14 == 7) {
      auVar30._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_00);
      auVar30._8_56_ = extraout_var_03;
    }
    else {
      local_1a8._0_4_ = DebugMLTSampler::Get1D(this_00);
      local_1a8._4_4_ = extraout_XMM0_Db;
      local_1a8._8_4_ = extraout_XMM0_Dc;
      local_1a8._12_4_ = extraout_XMM0_Dd;
      auVar29._0_4_ = DebugMLTSampler::Get1D(this_00);
      auVar29._4_60_ = extraout_var;
      uVar35 = local_1a8._8_8_;
      auVar24 = vinsertps_avx(local_1a8,auVar29._0_16_,0x10);
      auVar30 = ZEXT1664(auVar24);
    }
    auVar32 = auVar30._8_56_;
    local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar30._0_16_);
    uc.n = 1;
    uc.ptr = &local_160;
    u.n = 1;
    u.ptr = (Point2<float> *)&local_b0;
    SVar40 = BSDF::rho(pBVar18,woRender,uc,u);
    local_138 = SVar40.values.values._8_8_;
    auVar31._0_8_ = SVar40.values.values._0_8_;
    auVar31._8_56_ = auVar32;
    local_1a8 = auVar31._0_16_;
    uStack_130 = uVar35;
    pauVar20 = (undefined1 (*) [16])ScratchBuffer::Alloc(local_178,0x10,4);
    auVar15._8_8_ = uStack_130;
    auVar15._0_8_ = local_138;
    auVar24 = vunpcklpd_avx(local_1a8,auVar15);
    *pauVar20 = auVar24;
    local_128.
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
    .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
             )((ulong)pauVar20 | 0x1000000000000);
    BSDF::BSDF((BSDF *)&local_b0,woRender,(Normal3f *)local_188._0_8_,(Normal3f *)local_198._0_8_,
               &(this->shading).dpdu,&local_128);
    (pBVar18->bxdf).
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
    .bits = local_b0.p.super_Tuple3<pbrt::Point3,_float>._0_8_;
    (pBVar18->ng).super_Tuple3<pbrt::Normal3,_float>.x =
         local_b0.p.super_Tuple3<pbrt::Point3,_float>.z;
    (pBVar18->ng).super_Tuple3<pbrt::Normal3,_float>.y =
         local_b0.uv.super_Tuple2<pbrt::Point2,_float>.x;
    *(ulong *)&(pBVar18->ng).super_Tuple3<pbrt::Normal3,_float>.z =
         CONCAT44(local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.x,
                  local_b0.uv.super_Tuple2<pbrt::Point2,_float>.y);
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y =
         local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z =
         local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x =
         local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y =
         local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.y =
         local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
    (pBVar18->shadingFrame).x.super_Tuple3<pbrt::Vector3,_float>.z =
         local_b0.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.x =
         local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    (pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.y =
         local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    *(ulong *)&(pBVar18->shadingFrame).y.super_Tuple3<pbrt::Vector3,_float>.z =
         CONCAT44(local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x,
                  local_b0.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z);
    (pBVar18->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.y =
         local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    (pBVar18->shadingFrame).z.super_Tuple3<pbrt::Vector3,_float>.z =
         local_b0.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
  }
  return pBVar18;
}

Assistant:

BSDF SurfaceInteraction::GetBSDF(const RayDifferential &ray, SampledWavelengths &lambda,
                                 CameraHandle camera, ScratchBuffer &scratchBuffer,
                                 SamplerHandle sampler) {
    ComputeDifferentials(ray, camera, sampler.SamplesPerPixel());
    // Resolve _MixMaterial_ if necessary
    while (material.Is<MixMaterial>()) {
        MixMaterial *mix = material.CastOrNullptr<MixMaterial>();
        material = mix->ChooseMaterial(UniversalTextureEvaluator(), *this);
    }

    // Return unset _BSDF_ if surface has a null material
    if (!material)
        return {};

    // Evaluate bump map and compute shading normal
    FloatTextureHandle displacement = material.GetDisplacement();
    const Image *normalMap = material.GetNormalMap();
    if (displacement || normalMap) {
        Vector3f dpdu, dpdv;
        Bump(UniversalTextureEvaluator(), displacement, normalMap, *this, &dpdu, &dpdv);
        SetShadingGeometry(Normal3f(Normalize(Cross(dpdu, dpdv))), dpdu, dpdv,
                           shading.dndu, shading.dndv, false);
    }

    // Return BSDF for surface interaction
    BSDF bsdf =
        material.GetBSDF(UniversalTextureEvaluator(), *this, lambda, scratchBuffer);
    if (bsdf && GetOptions().forceDiffuse) {
        // Override _bsdf_ with diffuse equivalent
        SampledSpectrum r = bsdf.rho(wo, {sampler.Get1D()}, {sampler.Get2D()});
        bsdf = BSDF(wo, n, shading.n, shading.dpdu,
                    scratchBuffer.Alloc<IdealDiffuseBxDF>(r));
    }
    return bsdf;
}